

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCArray NULLC::DoubleToStr(int precision,bool exponent,double *r)

{
  size_t sVar1;
  NULLCArray NVar2;
  char *local_168;
  char *local_148;
  uint local_140;
  char local_128 [8];
  char buf [256];
  double *r_local;
  bool exponent_local;
  char *pcStack_14;
  int precision_local;
  NULLCArray arr;
  
  buf._248_8_ = r;
  memset(&stack0xffffffffffffffec,0,0xc);
  if (buf._248_8_ == 0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    if (exponent) {
      local_168 = "%.*e";
    }
    else {
      local_168 = "%.*f";
    }
    SafeSprintf(local_128,0x100,local_168,*(undefined8 *)buf._248_8_,(ulong)(uint)precision);
    sVar1 = strlen(local_128);
    NVar2 = AllocArray(1,(int)sVar1 + 1,2);
    local_148 = NVar2.ptr;
    local_140 = NVar2.len;
    pcStack_14 = local_148;
    arr.ptr._0_4_ = local_140;
    memcpy(local_148,local_128,(ulong)local_140);
  }
  NVar2.len = (uint)arr.ptr;
  NVar2.ptr = pcStack_14;
  return NVar2;
}

Assistant:

NULLCArray NULLC::DoubleToStr(int precision, bool exponent, double* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	char buf[256];
	SafeSprintf(buf, 256, exponent ? "%.*e" : "%.*f", precision, *r);
	arr = AllocArray(1, (int)strlen(buf) + 1, NULLC_TYPE_CHAR);
	memcpy(arr.ptr, buf, arr.len);
	return arr;
}